

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argagg.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
argagg::option_results::as<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,option_results *this)

{
  pointer poVar1;
  out_of_range *this_00;
  
  poVar1 = (this->all).
           super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (poVar1 != (this->all).
                super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>.
                _M_impl.super__Vector_impl_data._M_start) {
    option_result::as<std::__cxx11::string>(__return_storage_ptr__,poVar1 + -1);
    return __return_storage_ptr__;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"no option arguments to convert");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

T option_results::as() const
{
  if (this->all.size() == 0) {
    throw std::out_of_range("no option arguments to convert");
  }
  return this->all.back().as<T>();
}